

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

int QuantizeBlock_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  int16_t iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  unkbyte10 Var18;
  unkbyte10 Var19;
  int iVar20;
  int iVar21;
  short sVar22;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar23 [16];
  short sVar31;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar32 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  short sVar52;
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  short sVar59;
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar49 [12];
  undefined1 auVar51 [16];
  undefined1 auVar56 [12];
  undefined1 auVar58 [16];
  
  auVar23 = *(undefined1 (*) [16])in;
  auVar32 = *(undefined1 (*) [16])(in + 8);
  auVar41 = *(undefined1 (*) [16])mtx->iq_;
  auVar45 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar22 = auVar23._0_2_;
  sVar52 = -sVar22;
  sVar24 = auVar23._2_2_;
  sVar59 = -sVar24;
  sVar25 = auVar23._4_2_;
  sVar2 = -sVar25;
  sVar26 = auVar23._6_2_;
  sVar3 = -sVar26;
  sVar27 = auVar23._8_2_;
  sVar4 = -sVar27;
  sVar28 = auVar23._10_2_;
  sVar5 = -sVar28;
  sVar29 = auVar23._12_2_;
  sVar6 = -sVar29;
  sVar30 = auVar23._14_2_;
  sVar7 = -sVar30;
  auVar23 = psraw(auVar23,0xf);
  sVar31 = auVar32._0_2_;
  sVar8 = -sVar31;
  sVar33 = auVar32._2_2_;
  sVar9 = -sVar33;
  sVar34 = auVar32._4_2_;
  sVar10 = -sVar34;
  sVar35 = auVar32._6_2_;
  sVar11 = -sVar35;
  sVar36 = auVar32._8_2_;
  sVar12 = -sVar36;
  sVar37 = auVar32._10_2_;
  sVar13 = -sVar37;
  sVar38 = auVar32._12_2_;
  sVar14 = -sVar38;
  sVar39 = auVar32._14_2_;
  sVar15 = -sVar39;
  auVar32 = psraw(auVar32,0xf);
  auVar57._0_2_ =
       mtx->sharpen_[0] + ((ushort)(sVar52 < sVar22) * sVar22 | (ushort)(sVar52 >= sVar22) * sVar52)
  ;
  auVar57._2_2_ =
       mtx->sharpen_[1] + ((ushort)(sVar59 < sVar24) * sVar24 | (ushort)(sVar59 >= sVar24) * sVar59)
  ;
  auVar57._4_2_ =
       mtx->sharpen_[2] + ((ushort)(sVar2 < sVar25) * sVar25 | (ushort)(sVar2 >= sVar25) * sVar2);
  auVar57._6_2_ =
       mtx->sharpen_[3] + ((ushort)(sVar3 < sVar26) * sVar26 | (ushort)(sVar3 >= sVar26) * sVar3);
  auVar57._8_2_ =
       mtx->sharpen_[4] + ((ushort)(sVar4 < sVar27) * sVar27 | (ushort)(sVar4 >= sVar27) * sVar4);
  auVar57._10_2_ =
       mtx->sharpen_[5] + ((ushort)(sVar5 < sVar28) * sVar28 | (ushort)(sVar5 >= sVar28) * sVar5);
  auVar57._12_2_ =
       mtx->sharpen_[6] + ((ushort)(sVar6 < sVar29) * sVar29 | (ushort)(sVar6 >= sVar29) * sVar6);
  auVar57._14_2_ =
       mtx->sharpen_[7] + ((ushort)(sVar7 < sVar30) * sVar30 | (ushort)(sVar7 >= sVar30) * sVar7);
  auVar50._0_2_ =
       mtx->sharpen_[8] + ((ushort)(sVar8 < sVar31) * sVar31 | (ushort)(sVar8 >= sVar31) * sVar8);
  auVar50._2_2_ =
       mtx->sharpen_[9] + ((ushort)(sVar9 < sVar33) * sVar33 | (ushort)(sVar9 >= sVar33) * sVar9);
  auVar50._4_2_ =
       mtx->sharpen_[10] +
       ((ushort)(sVar10 < sVar34) * sVar34 | (ushort)(sVar10 >= sVar34) * sVar10);
  auVar50._6_2_ =
       mtx->sharpen_[0xb] +
       ((ushort)(sVar11 < sVar35) * sVar35 | (ushort)(sVar11 >= sVar35) * sVar11);
  auVar50._8_2_ =
       mtx->sharpen_[0xc] +
       ((ushort)(sVar12 < sVar36) * sVar36 | (ushort)(sVar12 >= sVar36) * sVar12);
  auVar50._10_2_ =
       mtx->sharpen_[0xd] +
       ((ushort)(sVar13 < sVar37) * sVar37 | (ushort)(sVar13 >= sVar37) * sVar13);
  auVar50._12_2_ =
       mtx->sharpen_[0xe] +
       ((ushort)(sVar14 < sVar38) * sVar38 | (ushort)(sVar14 >= sVar38) * sVar14);
  auVar50._14_2_ =
       mtx->sharpen_[0xf] +
       ((ushort)(sVar15 < sVar39) * sVar39 | (ushort)(sVar15 >= sVar39) * sVar15);
  auVar53 = pmulhuw(auVar57,auVar41);
  sVar59 = auVar57._6_2_ * auVar41._6_2_;
  auVar40 = pmulhuw(auVar50,auVar45);
  sVar52 = auVar50._6_2_ * auVar45._6_2_;
  iVar20 = CONCAT22(auVar53._6_2_,sVar59);
  Var18 = CONCAT64(CONCAT42(iVar20,auVar53._4_2_),CONCAT22(auVar57._4_2_ * auVar41._4_2_,sVar59));
  auVar16._4_8_ = (long)((unkuint10)Var18 >> 0x10);
  auVar16._2_2_ = auVar53._2_2_;
  auVar16._0_2_ = auVar57._2_2_ * auVar41._2_2_;
  iVar55 = CONCAT22(auVar53._8_2_,auVar57._8_2_ * auVar41._8_2_);
  auVar56._0_8_ = CONCAT26(auVar53._10_2_,CONCAT24(auVar57._10_2_ * auVar41._10_2_,iVar55));
  auVar56._8_2_ = auVar57._12_2_ * auVar41._12_2_;
  auVar56._10_2_ = auVar53._12_2_;
  auVar58._12_2_ = auVar57._14_2_ * auVar41._14_2_;
  auVar58._0_12_ = auVar56;
  auVar58._14_2_ = auVar53._14_2_;
  iVar21 = CONCAT22(auVar40._6_2_,sVar52);
  Var19 = CONCAT64(CONCAT42(iVar21,auVar40._4_2_),CONCAT22(auVar50._4_2_ * auVar45._4_2_,sVar52));
  auVar17._4_8_ = (long)((unkuint10)Var19 >> 0x10);
  auVar17._2_2_ = auVar40._2_2_;
  auVar17._0_2_ = auVar50._2_2_ * auVar45._2_2_;
  iVar48 = CONCAT22(auVar40._8_2_,auVar50._8_2_ * auVar45._8_2_);
  auVar49._0_8_ = CONCAT26(auVar40._10_2_,CONCAT24(auVar50._10_2_ * auVar45._10_2_,iVar48));
  auVar49._8_2_ = auVar50._12_2_ * auVar45._12_2_;
  auVar49._10_2_ = auVar40._12_2_;
  auVar51._12_2_ = auVar50._14_2_ * auVar45._14_2_;
  auVar51._0_12_ = auVar49;
  auVar51._14_2_ = auVar40._14_2_;
  auVar53._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar53._0_2_,auVar57._0_2_ * auVar41._0_2_)) >> 0x11;
  auVar53._4_4_ = (int)(mtx->bias_[1] + auVar16._0_4_) >> 0x11;
  auVar53._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var18 >> 0x10)) >> 0x11;
  auVar53._12_4_ = (int)(mtx->bias_[3] + iVar20) >> 0x11;
  auVar60._0_4_ = (int)(mtx->bias_[4] + iVar55) >> 0x11;
  auVar60._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar56._0_8_ >> 0x20)) >> 0x11;
  auVar60._8_4_ = (int)(mtx->bias_[6] + auVar56._8_4_) >> 0x11;
  auVar60._12_4_ = (int)(mtx->bias_[7] + auVar58._12_4_) >> 0x11;
  auVar41 = packssdw(auVar53,auVar60);
  auVar44._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar40._0_2_,auVar50._0_2_ * auVar45._0_2_)) >> 0x11;
  auVar44._4_4_ = (int)(mtx->bias_[9] + auVar17._0_4_) >> 0x11;
  auVar44._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var19 >> 0x10)) >> 0x11;
  auVar44._12_4_ = (int)(mtx->bias_[0xb] + iVar21) >> 0x11;
  auVar54._0_4_ = (int)(mtx->bias_[0xc] + iVar48) >> 0x11;
  auVar54._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar49._0_8_ >> 0x20)) >> 0x11;
  auVar54._8_4_ = (int)(mtx->bias_[0xe] + auVar49._8_4_) >> 0x11;
  auVar54._12_4_ = (int)(mtx->bias_[0xf] + auVar51._12_4_) >> 0x11;
  auVar45 = packssdw(auVar44,auVar54);
  sVar52 = auVar41._0_2_;
  auVar42._0_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar41._2_2_;
  auVar42._2_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar41._4_2_;
  auVar42._4_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar41._6_2_;
  auVar42._6_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar41._8_2_;
  auVar42._8_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar41._10_2_;
  auVar42._10_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar41._12_2_;
  sVar59 = auVar41._14_2_;
  auVar42._12_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  auVar42._14_2_ = (ushort)(0x7ff < sVar59) * 0x7ff | (ushort)(0x7ff >= sVar59) * sVar59;
  sVar52 = auVar45._0_2_;
  auVar46._0_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar45._2_2_;
  auVar46._2_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar45._4_2_;
  auVar46._4_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar45._6_2_;
  auVar46._6_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar45._8_2_;
  auVar46._8_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar45._10_2_;
  auVar46._10_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  sVar52 = auVar45._12_2_;
  sVar59 = auVar45._14_2_;
  auVar46._12_2_ = (ushort)(0x7ff < sVar52) * 0x7ff | (ushort)(0x7ff >= sVar52) * sVar52;
  auVar46._14_2_ = (ushort)(0x7ff < sVar59) * 0x7ff | (ushort)(0x7ff >= sVar59) * sVar59;
  auVar42 = auVar42 ^ auVar23;
  auVar46 = auVar46 ^ auVar32;
  auVar43._0_2_ = auVar42._0_2_ - auVar23._0_2_;
  auVar43._2_2_ = auVar42._2_2_ - auVar23._2_2_;
  auVar43._4_2_ = auVar42._4_2_ - auVar23._4_2_;
  auVar43._6_2_ = auVar42._6_2_ - auVar23._6_2_;
  auVar43._8_2_ = auVar42._8_2_ - auVar23._8_2_;
  auVar43._10_2_ = auVar42._10_2_ - auVar23._10_2_;
  auVar43._12_2_ = auVar42._12_2_ - auVar23._12_2_;
  auVar43._14_2_ = auVar42._14_2_ - auVar23._14_2_;
  auVar47._0_2_ = auVar46._0_2_ - auVar32._0_2_;
  auVar47._2_2_ = auVar46._2_2_ - auVar32._2_2_;
  auVar47._4_2_ = auVar46._4_2_ - auVar32._4_2_;
  auVar47._6_2_ = auVar46._6_2_ - auVar32._6_2_;
  auVar47._8_2_ = auVar46._8_2_ - auVar32._8_2_;
  auVar47._10_2_ = auVar46._10_2_ - auVar32._10_2_;
  auVar47._12_2_ = auVar46._12_2_ - auVar32._12_2_;
  auVar47._14_2_ = auVar46._14_2_ - auVar32._14_2_;
  auVar23._0_2_ = mtx->q_[0] * auVar43._0_2_;
  auVar23._2_2_ = mtx->q_[1] * auVar43._2_2_;
  auVar23._4_2_ = mtx->q_[2] * auVar43._4_2_;
  auVar23._6_2_ = mtx->q_[3] * auVar43._6_2_;
  auVar23._8_2_ = mtx->q_[4] * auVar43._8_2_;
  auVar23._10_2_ = mtx->q_[5] * auVar43._10_2_;
  auVar23._12_2_ = mtx->q_[6] * auVar43._12_2_;
  auVar23._14_2_ = mtx->q_[7] * auVar43._14_2_;
  auVar45._0_2_ = mtx->q_[8] * auVar47._0_2_;
  auVar45._2_2_ = mtx->q_[9] * auVar47._2_2_;
  auVar45._4_2_ = mtx->q_[10] * auVar47._4_2_;
  auVar45._6_2_ = mtx->q_[0xb] * auVar47._6_2_;
  auVar45._8_2_ = mtx->q_[0xc] * auVar47._8_2_;
  auVar45._10_2_ = mtx->q_[0xd] * auVar47._10_2_;
  auVar45._12_2_ = mtx->q_[0xe] * auVar47._12_2_;
  auVar45._14_2_ = mtx->q_[0xf] * auVar47._14_2_;
  *(undefined1 (*) [16])in = auVar23;
  *(undefined1 (*) [16])(in + 8) = auVar45;
  auVar23 = pshufhw(auVar23,auVar43,0xc6);
  auVar32._0_4_ = auVar23._0_4_;
  auVar32._8_4_ = auVar23._8_4_;
  auVar32._4_4_ = auVar23._12_4_;
  auVar32._12_4_ = auVar23._4_4_;
  auVar23 = pshufhw(auVar32,auVar32,0x39);
  auVar32 = pshuflw(auVar45,auVar47,0xc6);
  auVar40._0_4_ = auVar32._0_4_;
  auVar40._12_4_ = auVar32._12_4_;
  auVar40._4_4_ = auVar32._8_4_;
  auVar40._8_4_ = auVar32._4_4_;
  auVar32 = pshuflw(auVar40,auVar40,0x39);
  *(undefined1 (*) [16])out = auVar23;
  *(undefined1 (*) [16])(out + 8) = auVar32;
  auVar23 = packsswb(auVar23,auVar32);
  iVar1 = out[3];
  out[3] = out[0xc];
  out[0xc] = iVar1;
  auVar41[0] = -(auVar23[0] == '\0');
  auVar41[1] = -(auVar23[1] == '\0');
  auVar41[2] = -(auVar23[2] == '\0');
  auVar41[3] = -(auVar23[3] == '\0');
  auVar41[4] = -(auVar23[4] == '\0');
  auVar41[5] = -(auVar23[5] == '\0');
  auVar41[6] = -(auVar23[6] == '\0');
  auVar41[7] = -(auVar23[7] == '\0');
  auVar41[8] = -(auVar23[8] == '\0');
  auVar41[9] = -(auVar23[9] == '\0');
  auVar41[10] = -(auVar23[10] == '\0');
  auVar41[0xb] = -(auVar23[0xb] == '\0');
  auVar41[0xc] = -(auVar23[0xc] == '\0');
  auVar41[0xd] = -(auVar23[0xd] == '\0');
  auVar41[0xe] = -(auVar23[0xe] == '\0');
  auVar41[0xf] = -(auVar23[0xf] == '\0');
  return (int)((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar41[0xf] >> 7) << 0xf) != 0xffff);
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(int16_t in[16], int16_t out[16],
                                            const uint16_t* const sharpen,
                                            const VP8Matrix* const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}